

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.cpp
# Opt level: O0

function_map * skiwi::(anonymous_namespace)::generate_inlined_primitives_abi_cxx11_(void)

{
  map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  *in_RDI;
  __enable_if_t<is_constructible<value_type,_pair<basic_string<char>,_void_(*)(asmcode_&,_const_compiler_options_&)>_>::value,_pair<iterator,_bool>_>
  _Var1;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1898;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1890;
  _Base_ptr local_1868;
  undefined1 local_1860;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1858;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1850;
  _Base_ptr local_1828;
  undefined1 local_1820;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1818;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1810;
  _Base_ptr local_17e8;
  undefined1 local_17e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_17d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_17d0;
  _Base_ptr local_17a8;
  undefined1 local_17a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1798;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1790;
  _Base_ptr local_1768;
  undefined1 local_1760;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1758;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1750;
  _Base_ptr local_1728;
  undefined1 local_1720;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1718;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1710;
  _Base_ptr local_16e8;
  undefined1 local_16e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_16d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_16d0;
  _Base_ptr local_16a8;
  undefined1 local_16a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1698;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1690;
  _Base_ptr local_1668;
  undefined1 local_1660;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1658;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1650;
  _Base_ptr local_1628;
  undefined1 local_1620;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1618;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1610;
  _Base_ptr local_15e8;
  undefined1 local_15e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_15d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_15d0;
  _Base_ptr local_15a8;
  undefined1 local_15a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1598;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1590;
  _Base_ptr local_1568;
  undefined1 local_1560;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1558;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1550;
  _Base_ptr local_1528;
  undefined1 local_1520;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1518;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1510;
  _Base_ptr local_14e8;
  undefined1 local_14e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_14d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_14d0;
  _Base_ptr local_14a8;
  undefined1 local_14a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1498;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1490;
  _Base_ptr local_1468;
  undefined1 local_1460;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1458;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1450;
  _Base_ptr local_1428;
  undefined1 local_1420;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1418;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1410;
  _Base_ptr local_13e8;
  undefined1 local_13e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_13d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_13d0;
  _Base_ptr local_13a8;
  undefined1 local_13a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1398;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1390;
  _Base_ptr local_1368;
  undefined1 local_1360;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1358;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1350;
  _Base_ptr local_1328;
  undefined1 local_1320;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1318;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1310;
  _Base_ptr local_12e8;
  undefined1 local_12e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_12d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_12d0;
  _Base_ptr local_12a8;
  undefined1 local_12a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1290;
  _Base_ptr local_1268;
  undefined1 local_1260;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1250;
  _Base_ptr local_1228;
  undefined1 local_1220;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1218;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1210;
  _Base_ptr local_11e8;
  undefined1 local_11e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_11d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_11d0;
  _Base_ptr local_11a8;
  undefined1 local_11a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1190;
  _Base_ptr local_1168;
  undefined1 local_1160;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1150;
  _Base_ptr local_1128;
  undefined1 local_1120;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1110;
  _Base_ptr local_10e8;
  undefined1 local_10e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_10d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_10d0;
  _Base_ptr local_10a8;
  undefined1 local_10a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1098;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1090;
  _Base_ptr local_1068;
  undefined1 local_1060;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1058;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1050;
  _Base_ptr local_1028;
  undefined1 local_1020;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1018;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1010;
  _Base_ptr local_fe8;
  undefined1 local_fe0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_fd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_fd0;
  _Base_ptr local_fa8;
  undefined1 local_fa0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_f98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_f90;
  _Base_ptr local_f68;
  undefined1 local_f60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_f58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_f50;
  _Base_ptr local_f28;
  undefined1 local_f20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_f18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_f10;
  _Base_ptr local_ee8;
  undefined1 local_ee0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_ed8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_ed0;
  _Base_ptr local_ea8;
  undefined1 local_ea0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_e98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_e90;
  _Base_ptr local_e68;
  undefined1 local_e60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_e58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_e50;
  _Base_ptr local_e28;
  undefined1 local_e20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_e18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_e10;
  _Base_ptr local_de8;
  undefined1 local_de0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_dd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_dd0;
  _Base_ptr local_da8;
  undefined1 local_da0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_d98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_d90;
  _Base_ptr local_d68;
  undefined1 local_d60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_d58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_d50;
  _Base_ptr local_d28;
  undefined1 local_d20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_d18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_d10;
  _Base_ptr local_ce8;
  undefined1 local_ce0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_cd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_cd0;
  _Base_ptr local_ca8;
  undefined1 local_ca0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_c98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_c90;
  _Base_ptr local_c68;
  undefined1 local_c60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_c58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_c50;
  _Base_ptr local_c28;
  undefined1 local_c20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_c18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_c10;
  _Base_ptr local_be8;
  undefined1 local_be0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_bd8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_bd0;
  _Base_ptr local_ba8;
  undefined1 local_ba0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_b98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_b90;
  _Base_ptr local_b68;
  undefined1 local_b60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_b58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_b50;
  _Base_ptr local_b28;
  undefined1 local_b20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_b18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_b10;
  _Base_ptr local_ae8;
  undefined1 local_ae0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_ad8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_ad0;
  _Base_ptr local_aa8;
  undefined1 local_aa0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_a98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_a90;
  _Base_ptr local_a68;
  undefined1 local_a60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_a58;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_a50;
  _Base_ptr local_a28;
  undefined1 local_a20;
  _func_void_asmcode_ptr_compiler_options_ptr *local_a18;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_a10;
  _Base_ptr local_9e8;
  undefined1 local_9e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_9d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_9d0;
  _Base_ptr local_9a8;
  undefined1 local_9a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_998;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_990;
  _Base_ptr local_968;
  undefined1 local_960;
  _func_void_asmcode_ptr_compiler_options_ptr *local_958;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_950;
  _Base_ptr local_928;
  undefined1 local_920;
  _func_void_asmcode_ptr_compiler_options_ptr *local_918;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_910;
  _Base_ptr local_8e8;
  undefined1 local_8e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_8d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_8d0;
  _Base_ptr local_8a8;
  undefined1 local_8a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_898;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_890;
  _Base_ptr local_868;
  undefined1 local_860;
  _func_void_asmcode_ptr_compiler_options_ptr *local_858;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_850;
  _Base_ptr local_828;
  undefined1 local_820;
  _func_void_asmcode_ptr_compiler_options_ptr *local_818;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_810;
  _Base_ptr local_7e8;
  undefined1 local_7e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_7d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_7d0;
  _Base_ptr local_7a8;
  undefined1 local_7a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_798;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_790;
  _Base_ptr local_768;
  undefined1 local_760;
  _func_void_asmcode_ptr_compiler_options_ptr *local_758;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_750;
  _Base_ptr local_728;
  undefined1 local_720;
  _func_void_asmcode_ptr_compiler_options_ptr *local_718;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_710;
  _Base_ptr local_6e8;
  undefined1 local_6e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_6d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_6d0;
  _Base_ptr local_6a8;
  undefined1 local_6a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_698;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_690;
  _Base_ptr local_668;
  undefined1 local_660;
  _func_void_asmcode_ptr_compiler_options_ptr *local_658;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_650;
  _Base_ptr local_628;
  undefined1 local_620;
  _func_void_asmcode_ptr_compiler_options_ptr *local_618;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_610;
  _Base_ptr local_5e8;
  undefined1 local_5e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_5d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_5d0;
  _Base_ptr local_5a8;
  undefined1 local_5a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_598;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_590;
  _Base_ptr local_568;
  undefined1 local_560;
  _func_void_asmcode_ptr_compiler_options_ptr *local_558;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_550;
  _Base_ptr local_528;
  undefined1 local_520;
  _func_void_asmcode_ptr_compiler_options_ptr *local_518;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_510;
  _Base_ptr local_4e8;
  undefined1 local_4e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_4d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_4d0;
  _Base_ptr local_4a8;
  undefined1 local_4a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_498;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_490;
  _Base_ptr local_468;
  undefined1 local_460;
  _func_void_asmcode_ptr_compiler_options_ptr *local_458;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_450;
  _Base_ptr local_428;
  undefined1 local_420;
  _func_void_asmcode_ptr_compiler_options_ptr *local_418;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_410;
  _Base_ptr local_3e8;
  undefined1 local_3e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_3d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_3d0;
  _Base_ptr local_3a8;
  undefined1 local_3a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_398;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_390;
  _Base_ptr local_368;
  undefined1 local_360;
  _func_void_asmcode_ptr_compiler_options_ptr *local_358;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_350;
  _Base_ptr local_328;
  undefined1 local_320;
  _func_void_asmcode_ptr_compiler_options_ptr *local_318;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_310;
  _Base_ptr local_2e8;
  undefined1 local_2e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_2d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_2d0;
  _Base_ptr local_2a8;
  undefined1 local_2a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_298;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_290;
  _Base_ptr local_268;
  undefined1 local_260;
  _func_void_asmcode_ptr_compiler_options_ptr *local_258;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_250;
  _Base_ptr local_228;
  undefined1 local_220;
  _func_void_asmcode_ptr_compiler_options_ptr *local_218;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_210;
  _Base_ptr local_1e8;
  undefined1 local_1e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_1d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_1d0;
  _Base_ptr local_1a8;
  undefined1 local_1a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_198;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_190;
  _Base_ptr local_168;
  undefined1 local_160;
  _func_void_asmcode_ptr_compiler_options_ptr *local_158;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_150;
  _Base_ptr local_128;
  undefined1 local_120;
  _func_void_asmcode_ptr_compiler_options_ptr *local_118;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_110;
  _Base_ptr local_e8;
  undefined1 local_e0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_d8;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_d0;
  _Base_ptr local_a8;
  undefined1 local_a0;
  _func_void_asmcode_ptr_compiler_options_ptr *local_98;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_90;
  _Base_ptr local_68;
  undefined1 local_60;
  _func_void_asmcode_ptr_compiler_options_ptr *local_48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  local_40;
  undefined1 local_11;
  function_map *fm;
  
  local_11 = 0;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>_>_>
         *)in_RDI);
  local_48 = inline_remainder;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[12],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_40,(char (*) [12])"##remainder",&local_48);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_40);
  local_68 = (_Base_ptr)_Var1.first._M_node;
  local_60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_40);
  local_98 = inline_quotient;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_90,(char (*) [11])"##quotient",&local_98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_90);
  local_a8 = (_Base_ptr)_Var1.first._M_node;
  local_a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_90);
  local_d8 = inline_arithmetic_shift;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[19],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_d0,(char (*) [19])"##arithmetic-shift",&local_d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_d0);
  local_e8 = (_Base_ptr)_Var1.first._M_node;
  local_e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_d0);
  local_118 = inline_undefined;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_110,(char (*) [13])"##%undefined",&local_118);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_110);
  local_128 = (_Base_ptr)_Var1.first._M_node;
  local_120 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_110);
  local_158 = inline_skiwi_quiet_undefined;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[19],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_150,(char (*) [19])"##%quiet-undefined",&local_158);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_150);
  local_168 = (_Base_ptr)_Var1.first._M_node;
  local_160 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_150);
  local_198 = inline_vector_length;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_190,(char (*) [16])"##vector-length",&local_198);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_190);
  local_1a8 = (_Base_ptr)_Var1.first._M_node;
  local_1a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_190);
  local_1d8 = inline_fixnum_to_flonum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1d0,(char (*) [17])"##fixnum->flonum",&local_1d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1d0);
  local_1e8 = (_Base_ptr)_Var1.first._M_node;
  local_1e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1d0);
  local_218 = inline_flonum_to_fixnum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_210,(char (*) [17])"##flonum->fixnum",&local_218);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_210);
  local_228 = (_Base_ptr)_Var1.first._M_node;
  local_220 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_210);
  local_258 = inline_fixnum_to_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_250,(char (*) [15])"##fixnum->char",&local_258);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_250);
  local_268 = (_Base_ptr)_Var1.first._M_node;
  local_260 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_250);
  local_298 = inline_char_to_fixnum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_290,(char (*) [15])"##char->fixnum",&local_298);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_290);
  local_2a8 = (_Base_ptr)_Var1.first._M_node;
  local_2a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_290);
  local_2d8 = inline_fx_less;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_2d0,(char (*) [9])"##char<?",&local_2d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_2d0);
  local_2e8 = (_Base_ptr)_Var1.first._M_node;
  local_2e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_2d0);
  local_318 = inline_fx_leq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_310,(char (*) [10])"##char<=?",&local_318);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_310);
  local_328 = (_Base_ptr)_Var1.first._M_node;
  local_320 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_310);
  local_358 = inline_fx_greater;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_350,(char (*) [9])"##char>?",&local_358);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_350);
  local_368 = (_Base_ptr)_Var1.first._M_node;
  local_360 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_350);
  local_398 = inline_fx_geq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_390,(char (*) [10])"##char>=?",&local_398);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_390);
  local_3a8 = (_Base_ptr)_Var1.first._M_node;
  local_3a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_390);
  local_3d8 = inline_fx_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_3d0,(char (*) [9])"##char=?",&local_3d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_3d0);
  local_3e8 = (_Base_ptr)_Var1.first._M_node;
  local_3e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_3d0);
  local_418 = inline_bitwise_and;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_410,(char (*) [14])"##bitwise-and",&local_418);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_410);
  local_428 = (_Base_ptr)_Var1.first._M_node;
  local_420 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_410);
  local_458 = inline_bitwise_not;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_450,(char (*) [14])"##bitwise-not",&local_458);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_450);
  local_468 = (_Base_ptr)_Var1.first._M_node;
  local_460 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_450);
  local_498 = inline_bitwise_or;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_490,(char (*) [13])"##bitwise-or",&local_498);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_490);
  local_4a8 = (_Base_ptr)_Var1.first._M_node;
  local_4a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_490);
  local_4d8 = inline_bitwise_xor;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_4d0,(char (*) [14])"##bitwise-xor",&local_4d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_4d0);
  local_4e8 = (_Base_ptr)_Var1.first._M_node;
  local_4e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_4d0);
  local_518 = inline_ieee754_sign;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_510,(char (*) [15])"##ieee754-sign",&local_518);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_510);
  local_528 = (_Base_ptr)_Var1.first._M_node;
  local_520 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_510);
  local_558 = inline_ieee754_mantissa;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[19],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_550,(char (*) [19])"##ieee754-mantissa",&local_558);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_550);
  local_568 = (_Base_ptr)_Var1.first._M_node;
  local_560 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_550);
  local_598 = inline_ieee754_exponent;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[19],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_590,(char (*) [19])"##ieee754-exponent",&local_598);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_590);
  local_5a8 = (_Base_ptr)_Var1.first._M_node;
  local_5a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_590);
  local_5d8 = inline_ieee754_pi;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_5d0,(char (*) [13])"##ieee754-pi",&local_5d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_5d0);
  local_5e8 = (_Base_ptr)_Var1.first._M_node;
  local_5e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_5d0);
  local_618 = inline_ieee754_fxsin;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_610,(char (*) [16])"##ieee754-fxsin",&local_618);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_610);
  local_628 = (_Base_ptr)_Var1.first._M_node;
  local_620 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_610);
  local_658 = inline_ieee754_fxcos;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_650,(char (*) [16])"##ieee754-fxcos",&local_658);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_650);
  local_668 = (_Base_ptr)_Var1.first._M_node;
  local_660 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_650);
  local_698 = inline_ieee754_fxtan;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_690,(char (*) [16])"##ieee754-fxtan",&local_698);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_690);
  local_6a8 = (_Base_ptr)_Var1.first._M_node;
  local_6a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_690);
  local_6d8 = inline_ieee754_fxasin;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_6d0,(char (*) [17])"##ieee754-fxasin",&local_6d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_6d0);
  local_6e8 = (_Base_ptr)_Var1.first._M_node;
  local_6e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_6d0);
  local_718 = inline_ieee754_fxacos;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_710,(char (*) [17])"##ieee754-fxacos",&local_718);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_710);
  local_728 = (_Base_ptr)_Var1.first._M_node;
  local_720 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_710);
  local_758 = inline_ieee754_fxatan1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[18],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_750,(char (*) [18])"##ieee754-fxatan1",&local_758);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_750);
  local_768 = (_Base_ptr)_Var1.first._M_node;
  local_760 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_750);
  local_798 = inline_ieee754_fxlog;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_790,(char (*) [16])"##ieee754-fxlog",&local_798);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_790);
  local_7a8 = (_Base_ptr)_Var1.first._M_node;
  local_7a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_790);
  local_7d8 = inline_ieee754_fxround;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[18],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_7d0,(char (*) [18])"##ieee754-fxround",&local_7d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_7d0);
  local_7e8 = (_Base_ptr)_Var1.first._M_node;
  local_7e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_7d0);
  local_818 = inline_ieee754_fxtruncate;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[21],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_810,(char (*) [21])"##ieee754-fxtruncate",&local_818);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_810);
  local_828 = (_Base_ptr)_Var1.first._M_node;
  local_820 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_810);
  local_858 = inline_ieee754_fxsqrt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_850,(char (*) [17])"##ieee754-fxsqrt",&local_858);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_850);
  local_868 = (_Base_ptr)_Var1.first._M_node;
  local_860 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_850);
  local_898 = inline_ieee754_flsin;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_890,(char (*) [16])"##ieee754-flsin",&local_898);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_890);
  local_8a8 = (_Base_ptr)_Var1.first._M_node;
  local_8a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_890);
  local_8d8 = inline_ieee754_flcos;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_8d0,(char (*) [16])"##ieee754-flcos",&local_8d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_8d0);
  local_8e8 = (_Base_ptr)_Var1.first._M_node;
  local_8e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_8d0);
  local_918 = inline_ieee754_fltan;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_910,(char (*) [16])"##ieee754-fltan",&local_918);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_910);
  local_928 = (_Base_ptr)_Var1.first._M_node;
  local_920 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_910);
  local_958 = inline_ieee754_flasin;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_950,(char (*) [17])"##ieee754-flasin",&local_958);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_950);
  local_968 = (_Base_ptr)_Var1.first._M_node;
  local_960 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_950);
  local_998 = inline_ieee754_flacos;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_990,(char (*) [17])"##ieee754-flacos",&local_998);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_990);
  local_9a8 = (_Base_ptr)_Var1.first._M_node;
  local_9a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_990);
  local_9d8 = inline_ieee754_flatan1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[18],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_9d0,(char (*) [18])"##ieee754-flatan1",&local_9d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_9d0);
  local_9e8 = (_Base_ptr)_Var1.first._M_node;
  local_9e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_9d0);
  local_a18 = inline_ieee754_fllog;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[16],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_a10,(char (*) [16])"##ieee754-fllog",&local_a18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_a10);
  local_a28 = (_Base_ptr)_Var1.first._M_node;
  local_a20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_a10);
  local_a58 = inline_ieee754_flround;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[18],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_a50,(char (*) [18])"##ieee754-flround",&local_a58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_a50);
  local_a68 = (_Base_ptr)_Var1.first._M_node;
  local_a60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_a50);
  local_a98 = inline_ieee754_fltruncate;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[21],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_a90,(char (*) [21])"##ieee754-fltruncate",&local_a98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_a90);
  local_aa8 = (_Base_ptr)_Var1.first._M_node;
  local_aa0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_a90);
  local_ad8 = inline_ieee754_flsqrt;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[17],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_ad0,(char (*) [17])"##ieee754-flsqrt",&local_ad8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_ad0);
  local_ae8 = (_Base_ptr)_Var1.first._M_node;
  local_ae0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_ad0);
  local_b18 = inline_memq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_b10,(char (*) [7])"##memq",&local_b18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_b10);
  local_b28 = (_Base_ptr)_Var1.first._M_node;
  local_b20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_b10);
  local_b58 = inline_assq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_b50,(char (*) [7])"##assq",&local_b58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_b50);
  local_b68 = (_Base_ptr)_Var1.first._M_node;
  local_b60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_b50);
  local_b98 = inline_not;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_b90,(char (*) [6])"##not",&local_b98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_b90);
  local_ba8 = (_Base_ptr)_Var1.first._M_node;
  local_ba0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_b90);
  local_bd8 = inline_cons;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_bd0,(char (*) [7])"##cons",&local_bd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_bd0);
  local_be8 = (_Base_ptr)_Var1.first._M_node;
  local_be0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_bd0);
  local_c18 = inline_car;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_c10,(char (*) [6])"##car",&local_c18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_c10);
  local_c28 = (_Base_ptr)_Var1.first._M_node;
  local_c20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_c10);
  local_c58 = inline_cdr;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_c50,(char (*) [6])"##cdr",&local_c58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_c50);
  local_c68 = (_Base_ptr)_Var1.first._M_node;
  local_c60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_c50);
  local_c98 = inline_set_car;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_c90,(char (*) [11])"##set-car!",&local_c98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_c90);
  local_ca8 = (_Base_ptr)_Var1.first._M_node;
  local_ca0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_c90);
  local_cd8 = inline_set_cdr;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_cd0,(char (*) [11])"##set-cdr!",&local_cd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_cd0);
  local_ce8 = (_Base_ptr)_Var1.first._M_node;
  local_ce0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_cd0);
  local_d18 = inline_eq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_d10,(char (*) [6])"##eq?",&local_d18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_d10);
  local_d28 = (_Base_ptr)_Var1.first._M_node;
  local_d20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_d10);
  local_d58 = inline_fx_add1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_d50,(char (*) [9])"##fxadd1",&local_d58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_d50);
  local_d68 = (_Base_ptr)_Var1.first._M_node;
  local_d60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_d50);
  local_d98 = inline_fx_sub1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_d90,(char (*) [9])"##fxsub1",&local_d98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_d90);
  local_da8 = (_Base_ptr)_Var1.first._M_node;
  local_da0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_d90);
  local_dd8 = inline_fx_max;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_dd0,(char (*) [8])"##fxmax",&local_dd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_dd0);
  local_de8 = (_Base_ptr)_Var1.first._M_node;
  local_de0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_dd0);
  local_e18 = inline_fx_min;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_e10,(char (*) [8])"##fxmin",&local_e18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_e10);
  local_e28 = (_Base_ptr)_Var1.first._M_node;
  local_e20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_e10);
  local_e58 = inline_fx_is_zero;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_e50,(char (*) [10])"##fxzero?",&local_e58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_e50);
  local_e68 = (_Base_ptr)_Var1.first._M_node;
  local_e60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_e50);
  local_e98 = inline_fx_add;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_e90,(char (*) [6])"##fx+",&local_e98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_e90);
  local_ea8 = (_Base_ptr)_Var1.first._M_node;
  local_ea0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_e90);
  local_ed8 = inline_fx_sub;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_ed0,(char (*) [6])"##fx-",&local_ed8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_ed0);
  local_ee8 = (_Base_ptr)_Var1.first._M_node;
  local_ee0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_ed0);
  local_f18 = inline_fx_mul;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_f10,(char (*) [6])"##fx*",&local_f18);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_f10);
  local_f28 = (_Base_ptr)_Var1.first._M_node;
  local_f20 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_f10);
  local_f58 = inline_fx_div;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_f50,(char (*) [6])"##fx/",&local_f58);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_f50);
  local_f68 = (_Base_ptr)_Var1.first._M_node;
  local_f60 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_f50);
  local_f98 = inline_fx_less;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_f90,(char (*) [7])"##fx<?",&local_f98);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_f90);
  local_fa8 = (_Base_ptr)_Var1.first._M_node;
  local_fa0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_f90);
  local_fd8 = inline_fx_leq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_fd0,(char (*) [8])"##fx<=?",&local_fd8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_fd0);
  local_fe8 = (_Base_ptr)_Var1.first._M_node;
  local_fe0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_fd0);
  local_1018 = inline_fx_greater;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1010,(char (*) [7])"##fx>?",&local_1018);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1010);
  local_1028 = (_Base_ptr)_Var1.first._M_node;
  local_1020 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1010);
  local_1058 = inline_fx_geq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1050,(char (*) [8])"##fx>=?",&local_1058);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1050);
  local_1068 = (_Base_ptr)_Var1.first._M_node;
  local_1060 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1050);
  local_1098 = inline_fx_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1090,(char (*) [7])"##fx=?",&local_1098);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1090);
  local_10a8 = (_Base_ptr)_Var1.first._M_node;
  local_10a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1090);
  local_10d8 = inline_fx_not_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_10d0,(char (*) [8])"##fx!=?",&local_10d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_10d0);
  local_10e8 = (_Base_ptr)_Var1.first._M_node;
  local_10e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_10d0);
  local_1118 = inline_fl_add1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1110,(char (*) [9])"##fladd1",&local_1118);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1110);
  local_1128 = (_Base_ptr)_Var1.first._M_node;
  local_1120 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1110);
  local_1158 = inline_fl_sub1;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[9],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1150,(char (*) [9])"##flsub1",&local_1158);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1150);
  local_1168 = (_Base_ptr)_Var1.first._M_node;
  local_1160 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1150);
  local_1198 = inline_fl_max;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1190,(char (*) [8])"##flmax",&local_1198);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1190);
  local_11a8 = (_Base_ptr)_Var1.first._M_node;
  local_11a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1190);
  local_11d8 = inline_fl_min;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_11d0,(char (*) [8])"##flmin",&local_11d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_11d0);
  local_11e8 = (_Base_ptr)_Var1.first._M_node;
  local_11e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_11d0);
  local_1218 = inline_fl_is_zero;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1210,(char (*) [10])"##flzero?",&local_1218);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1210);
  local_1228 = (_Base_ptr)_Var1.first._M_node;
  local_1220 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1210);
  local_1258 = inline_fl_add;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1250,(char (*) [6])"##fl+",&local_1258);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1250);
  local_1268 = (_Base_ptr)_Var1.first._M_node;
  local_1260 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1250);
  local_1298 = inline_fl_mul;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1290,(char (*) [6])"##fl*",&local_1298);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1290);
  local_12a8 = (_Base_ptr)_Var1.first._M_node;
  local_12a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1290);
  local_12d8 = inline_fl_div;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_12d0,(char (*) [6])"##fl/",&local_12d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_12d0);
  local_12e8 = (_Base_ptr)_Var1.first._M_node;
  local_12e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_12d0);
  local_1318 = inline_fl_sub;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[6],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1310,(char (*) [6])"##fl-",&local_1318);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1310);
  local_1328 = (_Base_ptr)_Var1.first._M_node;
  local_1320 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1310);
  local_1358 = inline_fl_less;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1350,(char (*) [7])"##fl<?",&local_1358);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1350);
  local_1368 = (_Base_ptr)_Var1.first._M_node;
  local_1360 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1350);
  local_1398 = inline_fl_leq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1390,(char (*) [8])"##fl<=?",&local_1398);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1390);
  local_13a8 = (_Base_ptr)_Var1.first._M_node;
  local_13a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1390);
  local_13d8 = inline_fl_greater;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_13d0,(char (*) [7])"##fl>?",&local_13d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_13d0);
  local_13e8 = (_Base_ptr)_Var1.first._M_node;
  local_13e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_13d0);
  local_1418 = inline_fl_geq;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1410,(char (*) [8])"##fl>=?",&local_1418);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1410);
  local_1428 = (_Base_ptr)_Var1.first._M_node;
  local_1420 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1410);
  local_1458 = inline_fl_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[7],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1450,(char (*) [7])"##fl=?",&local_1458);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1450);
  local_1468 = (_Base_ptr)_Var1.first._M_node;
  local_1460 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1450);
  local_1498 = inline_fl_not_equal;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1490,(char (*) [8])"##fl!=?",&local_1498);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1490);
  local_14a8 = (_Base_ptr)_Var1.first._M_node;
  local_14a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1490);
  local_14d8 = inline_is_fixnum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_14d0,(char (*) [10])"##fixnum?",&local_14d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_14d0);
  local_14e8 = (_Base_ptr)_Var1.first._M_node;
  local_14e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_14d0);
  local_1518 = inline_is_flonum;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1510,(char (*) [10])"##flonum?",&local_1518);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1510);
  local_1528 = (_Base_ptr)_Var1.first._M_node;
  local_1520 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1510);
  local_1558 = inline_is_pair;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1550,(char (*) [8])"##pair?",&local_1558);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1550);
  local_1568 = (_Base_ptr)_Var1.first._M_node;
  local_1560 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1550);
  local_1598 = inline_is_vector;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1590,(char (*) [10])"##vector?",&local_1598);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1590);
  local_15a8 = (_Base_ptr)_Var1.first._M_node;
  local_15a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1590);
  local_15d8 = inline_is_string;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_15d0,(char (*) [10])"##string?",&local_15d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_15d0);
  local_15e8 = (_Base_ptr)_Var1.first._M_node;
  local_15e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_15d0);
  local_1618 = inline_is_symbol;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[10],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1610,(char (*) [10])"##symbol?",&local_1618);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1610);
  local_1628 = (_Base_ptr)_Var1.first._M_node;
  local_1620 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1610);
  local_1658 = inline_is_closure;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1650,(char (*) [11])"##closure?",&local_1658);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1650);
  local_1668 = (_Base_ptr)_Var1.first._M_node;
  local_1660 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1650);
  local_1698 = inline_is_procedure;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[13],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1690,(char (*) [13])"##procedure?",&local_1698);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1690);
  local_16a8 = (_Base_ptr)_Var1.first._M_node;
  local_16a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1690);
  local_16d8 = inline_is_boolean;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_16d0,(char (*) [11])"##boolean?",&local_16d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_16d0);
  local_16e8 = (_Base_ptr)_Var1.first._M_node;
  local_16e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_16d0);
  local_1718 = inline_is_nil;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1710,(char (*) [8])"##null?",&local_1718);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1710);
  local_1728 = (_Base_ptr)_Var1.first._M_node;
  local_1720 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1710);
  local_1758 = inline_is_eof_object;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1750,(char (*) [14])"##eof-object?",&local_1758);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1750);
  local_1768 = (_Base_ptr)_Var1.first._M_node;
  local_1760 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1750);
  local_1798 = inline_is_char;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1790,(char (*) [8])"##char?",&local_1798);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1790);
  local_17a8 = (_Base_ptr)_Var1.first._M_node;
  local_17a0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1790);
  local_17d8 = inline_is_promise;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[11],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_17d0,(char (*) [11])"##promise?",&local_17d8);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_17d0);
  local_17e8 = (_Base_ptr)_Var1.first._M_node;
  local_17e0 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_17d0);
  local_1818 = inline_is_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[8],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1810,(char (*) [8])"##port?",&local_1818);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1810);
  local_1828 = (_Base_ptr)_Var1.first._M_node;
  local_1820 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1810);
  local_1858 = inline_is_input_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[14],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1850,(char (*) [14])"##input-port?",&local_1858);
  _Var1 = std::
          map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
          ::
          insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
                    (in_RDI,&local_1850);
  local_1868 = (_Base_ptr)_Var1.first._M_node;
  local_1860 = _Var1.second;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1850);
  local_1898 = inline_is_output_port;
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::pair<const_char_(&)[15],_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&),_true>
            (&local_1890,(char (*) [15])"##output-port?",&local_1898);
  std::
  map<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&),std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>>
  ::
  insert<std::pair<std::__cxx11::string,void(*)(assembler::asmcode&,skiwi::compiler_options_const&)>>
            (in_RDI,&local_1890);
  std::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_(*)(assembler::asmcode_&,_const_skiwi::compiler_options_&)>
  ::~pair(&local_1890);
  return (function_map *)in_RDI;
}

Assistant:

function_map generate_inlined_primitives()
    {
    function_map fm;
    /*
    primitive names with a prefix ## are the inlined versions.
    */
    fm.insert(std::pair<std::string, fun_ptr>("##remainder", &inline_remainder));
    fm.insert(std::pair<std::string, fun_ptr>("##quotient", &inline_quotient));
    fm.insert(std::pair<std::string, fun_ptr>("##arithmetic-shift", &inline_arithmetic_shift));
    fm.insert(std::pair<std::string, fun_ptr>("##%undefined", &inline_undefined));
    fm.insert(std::pair<std::string, fun_ptr>("##%quiet-undefined", &inline_skiwi_quiet_undefined));
    fm.insert(std::pair<std::string, fun_ptr>("##vector-length", &inline_vector_length));
    fm.insert(std::pair<std::string, fun_ptr>("##fixnum->flonum", &inline_fixnum_to_flonum));
    fm.insert(std::pair<std::string, fun_ptr>("##flonum->fixnum", &inline_flonum_to_fixnum));
    fm.insert(std::pair<std::string, fun_ptr>("##fixnum->char", &inline_fixnum_to_char));
    fm.insert(std::pair<std::string, fun_ptr>("##char->fixnum", &inline_char_to_fixnum));
    fm.insert(std::pair<std::string, fun_ptr>("##char<?", &inline_fx_less));
    fm.insert(std::pair<std::string, fun_ptr>("##char<=?", &inline_fx_leq));
    fm.insert(std::pair<std::string, fun_ptr>("##char>?", &inline_fx_greater));
    fm.insert(std::pair<std::string, fun_ptr>("##char>=?", &inline_fx_geq));
    fm.insert(std::pair<std::string, fun_ptr>("##char=?", &inline_fx_equal));
    fm.insert(std::pair<std::string, fun_ptr>("##bitwise-and", &inline_bitwise_and));
    fm.insert(std::pair<std::string, fun_ptr>("##bitwise-not", &inline_bitwise_not));
    fm.insert(std::pair<std::string, fun_ptr>("##bitwise-or", &inline_bitwise_or));
    fm.insert(std::pair<std::string, fun_ptr>("##bitwise-xor", &inline_bitwise_xor));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-sign", &inline_ieee754_sign));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-mantissa", &inline_ieee754_mantissa));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-exponent", &inline_ieee754_exponent));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-pi", &inline_ieee754_pi));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxsin", &inline_ieee754_fxsin));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxcos", &inline_ieee754_fxcos));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxtan", &inline_ieee754_fxtan));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxasin", &inline_ieee754_fxasin));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxacos", &inline_ieee754_fxacos));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxatan1", &inline_ieee754_fxatan1));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxlog", &inline_ieee754_fxlog));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxround", &inline_ieee754_fxround));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxtruncate", &inline_ieee754_fxtruncate));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fxsqrt", &inline_ieee754_fxsqrt));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-flsin", &inline_ieee754_flsin));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-flcos", &inline_ieee754_flcos));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fltan", &inline_ieee754_fltan));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-flasin", &inline_ieee754_flasin));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-flacos", &inline_ieee754_flacos));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-flatan1", &inline_ieee754_flatan1));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fllog", &inline_ieee754_fllog));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-flround", &inline_ieee754_flround));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-fltruncate", &inline_ieee754_fltruncate));
    fm.insert(std::pair<std::string, fun_ptr>("##ieee754-flsqrt", &inline_ieee754_flsqrt));
    fm.insert(std::pair<std::string, fun_ptr>("##memq", &inline_memq));
    fm.insert(std::pair<std::string, fun_ptr>("##assq", &inline_assq));
    fm.insert(std::pair<std::string, fun_ptr>("##not", &inline_not));
    fm.insert(std::pair<std::string, fun_ptr>("##cons", &inline_cons));
    fm.insert(std::pair<std::string, fun_ptr>("##car", &inline_car));
    fm.insert(std::pair<std::string, fun_ptr>("##cdr", &inline_cdr));
    fm.insert(std::pair<std::string, fun_ptr>("##set-car!", &inline_set_car));
    fm.insert(std::pair<std::string, fun_ptr>("##set-cdr!", &inline_set_cdr));
    fm.insert(std::pair<std::string, fun_ptr>("##eq?", &inline_eq));
    fm.insert(std::pair<std::string, fun_ptr>("##fxadd1", &inline_fx_add1));
    fm.insert(std::pair<std::string, fun_ptr>("##fxsub1", &inline_fx_sub1));
    fm.insert(std::pair<std::string, fun_ptr>("##fxmax", &inline_fx_max));
    fm.insert(std::pair<std::string, fun_ptr>("##fxmin", &inline_fx_min));
    fm.insert(std::pair<std::string, fun_ptr>("##fxzero?", &inline_fx_is_zero));
    fm.insert(std::pair<std::string, fun_ptr>("##fx+", &inline_fx_add));
    fm.insert(std::pair<std::string, fun_ptr>("##fx-", &inline_fx_sub));
    fm.insert(std::pair<std::string, fun_ptr>("##fx*", &inline_fx_mul));
    fm.insert(std::pair<std::string, fun_ptr>("##fx/", &inline_fx_div));
    fm.insert(std::pair<std::string, fun_ptr>("##fx<?", &inline_fx_less));
    fm.insert(std::pair<std::string, fun_ptr>("##fx<=?", &inline_fx_leq));
    fm.insert(std::pair<std::string, fun_ptr>("##fx>?", &inline_fx_greater));
    fm.insert(std::pair<std::string, fun_ptr>("##fx>=?", &inline_fx_geq));
    fm.insert(std::pair<std::string, fun_ptr>("##fx=?", &inline_fx_equal));
    fm.insert(std::pair<std::string, fun_ptr>("##fx!=?", &inline_fx_not_equal));
    fm.insert(std::pair<std::string, fun_ptr>("##fladd1", &inline_fl_add1));
    fm.insert(std::pair<std::string, fun_ptr>("##flsub1", &inline_fl_sub1));
    fm.insert(std::pair<std::string, fun_ptr>("##flmax", &inline_fl_max));
    fm.insert(std::pair<std::string, fun_ptr>("##flmin", &inline_fl_min));
    fm.insert(std::pair<std::string, fun_ptr>("##flzero?", &inline_fl_is_zero));
    fm.insert(std::pair<std::string, fun_ptr>("##fl+", &inline_fl_add));
    fm.insert(std::pair<std::string, fun_ptr>("##fl*", &inline_fl_mul));
    fm.insert(std::pair<std::string, fun_ptr>("##fl/", &inline_fl_div));
    fm.insert(std::pair<std::string, fun_ptr>("##fl-", &inline_fl_sub));
    fm.insert(std::pair<std::string, fun_ptr>("##fl<?", &inline_fl_less));
    fm.insert(std::pair<std::string, fun_ptr>("##fl<=?", &inline_fl_leq));
    fm.insert(std::pair<std::string, fun_ptr>("##fl>?", &inline_fl_greater));
    fm.insert(std::pair<std::string, fun_ptr>("##fl>=?", &inline_fl_geq));
    fm.insert(std::pair<std::string, fun_ptr>("##fl=?", &inline_fl_equal));
    fm.insert(std::pair<std::string, fun_ptr>("##fl!=?", &inline_fl_not_equal));
    fm.insert(std::pair<std::string, fun_ptr>("##fixnum?", &inline_is_fixnum));
    fm.insert(std::pair<std::string, fun_ptr>("##flonum?", &inline_is_flonum));
    fm.insert(std::pair<std::string, fun_ptr>("##pair?", &inline_is_pair));
    fm.insert(std::pair<std::string, fun_ptr>("##vector?", &inline_is_vector));
    fm.insert(std::pair<std::string, fun_ptr>("##string?", &inline_is_string));
    fm.insert(std::pair<std::string, fun_ptr>("##symbol?", &inline_is_symbol));
    fm.insert(std::pair<std::string, fun_ptr>("##closure?", &inline_is_closure));
    fm.insert(std::pair<std::string, fun_ptr>("##procedure?", &inline_is_procedure));
    fm.insert(std::pair<std::string, fun_ptr>("##boolean?", &inline_is_boolean));
    fm.insert(std::pair<std::string, fun_ptr>("##null?", &inline_is_nil));
    fm.insert(std::pair<std::string, fun_ptr>("##eof-object?", &inline_is_eof_object));
    fm.insert(std::pair<std::string, fun_ptr>("##char?", &inline_is_char));
    fm.insert(std::pair<std::string, fun_ptr>("##promise?", &inline_is_promise));
    fm.insert(std::pair<std::string, fun_ptr>("##port?", &inline_is_port));
    fm.insert(std::pair<std::string, fun_ptr>("##input-port?", &inline_is_input_port));
    fm.insert(std::pair<std::string, fun_ptr>("##output-port?", &inline_is_output_port));
    return fm;
    }